

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void ui_keymap_create(char *title,wchar_t row)

{
  _Bool _Var1;
  bool bVar2;
  _Bool _Var3;
  char *pcVar4;
  keypress kVar6;
  keypress kVar7;
  ui_event_type local_4a0;
  uint8_t local_488;
  undefined4 uStack_484;
  wchar_t color;
  keypress kp;
  undefined4 local_450;
  char local_438 [4];
  wchar_t mode;
  char tmp [1024];
  keycode_t kStack_28;
  keypress c;
  size_t n;
  _Bool done;
  wchar_t row_local;
  char *title_local;
  undefined8 uVar5;
  
  bVar2 = false;
  c.code = 0;
  c.mods = '\0';
  c._9_3_ = 0;
  _Var1 = (player->opts).opt[1];
  prt(title,L'\r',L'\0');
  prt("Key: ",L'\x0e',L'\0');
  kVar6 = keymap_get_trigger();
  local_450 = CONCAT31(local_450._1_3_,kVar6.mods);
  kStack_28 = kVar6.code;
  if (kStack_28 == 0x3d) {
    c_prt('\f',"The \'=\' key is reserved.",L'\x10',L'\x02');
    prt("Press any key to continue.",L'\x12',L'\0');
    inkey();
  }
  else {
    while (!bVar2) {
      memset(&stack0xfffffffffffffb7c,0,0xc);
      local_488 = '\x01';
      if (c._4_8_ == 0) {
        local_488 = '\v';
      }
      if (c._4_8_ == 0x14) {
        local_488 = '\f';
      }
      keypress_to_text(local_438,0x400,keymap_buffer,false);
      pcVar4 = format("Action: %s",local_438);
      c_prt(local_488,pcVar4,L'\x0f',L'\0');
      c_prt('\x0e',"  Press \'=\' when finished.",L'\x11',L'\0');
      c_prt('\x0e',"  Use \'CTRL-u\' to reset.",L'\x12',L'\0');
      pcVar4 = format("(Maximum keymap length is %d keys.)",0x14);
      c_prt('\x0e',pcVar4,L'\x13',L'\0');
      kVar7 = inkey();
      uVar5 = kVar7._0_8_;
      local_4a0 = CONCAT31(local_4a0._1_3_,kVar7.mods);
      kp.type = local_4a0;
      color = kVar7.code;
      _uStack_484 = uVar5;
      if (color == L'=') {
        bVar2 = true;
      }
      else if (color == L'\x15') {
        memset(keymap_buffer,0,0xfc);
        c.code = 0;
        c.mods = '\0';
        c._9_3_ = 0;
      }
      else if (color == L'\x9e' || color == L'\x9f') {
        if (c._4_8_ != 0) {
          c._4_8_ = c._4_8_ + -1;
          keymap_buffer[c._4_8_].type = EVT_NONE;
          keymap_buffer[c._4_8_].code = 0;
          keymap_buffer[c._4_8_].mods = '\0';
        }
      }
      else if (c._4_8_ != 0x14) {
        if (c._4_8_ == 0) {
          memset(keymap_buffer,0,0xfc);
        }
        keymap_buffer[c._4_8_].type = uStack_484;
        keymap_buffer[c._4_8_].code = color;
        *(ui_event_type *)&keymap_buffer[c._4_8_].mods = kp.type;
        c._4_8_ = c._4_8_ + 1;
      }
    }
    if ((kStack_28 != 0) && (_Var3 = get_check("Keep this keymap? "), _Var3)) {
      kVar7._8_4_ = local_450;
      kVar7.type = (int)kVar6._0_8_;
      kVar7.code = (int)((ulong)kVar6._0_8_ >> 0x20);
      keymap_add(_Var1 & 1,kVar7,keymap_buffer,true);
      prt("To use in other sessions, save the keymaps to a file.  Press a key to continue.",L'\x11',
          L'\0');
      inkey();
    }
  }
  return;
}

Assistant:

static void ui_keymap_create(const char *title, int row)
{
	bool done = false;
	size_t n = 0;

	struct keypress c;
	char tmp[1024];
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	prt(title, 13, 0);
	prt("Key: ", 14, 0);

	c = keymap_get_trigger();
	if (c.code == '=') {
		c_prt(COLOUR_L_RED, "The '=' key is reserved.", 16, 2);
		prt("Press any key to continue.", 18, 0);
		inkey();
		return;
	}

	/* Get an encoded action, with a default response */
	while (!done) {
		struct keypress kp = {EVT_NONE, 0, 0};

		int color = COLOUR_WHITE;
		if (n == 0) color = COLOUR_YELLOW;
		if (n == KEYMAP_ACTION_MAX) color = COLOUR_L_RED;

		keypress_to_text(tmp, sizeof(tmp), keymap_buffer, false);
		c_prt(color, format("Action: %s", tmp), 15, 0);

		c_prt(COLOUR_L_BLUE, "  Press '=' when finished.", 17, 0);
		c_prt(COLOUR_L_BLUE, "  Use 'CTRL-u' to reset.", 18, 0);
		c_prt(COLOUR_L_BLUE, format("(Maximum keymap length is %d keys.)",
									KEYMAP_ACTION_MAX), 19, 0);

		kp = inkey();

		if (kp.code == '=') {
			done = true;
			continue;
		}

		switch (kp.code) {
			case KC_DELETE:
			case KC_BACKSPACE: {
				if (n > 0) {
					n -= 1;
				    keymap_buffer[n].type = 0;
					keymap_buffer[n].code = 0;
					keymap_buffer[n].mods = 0;
				}
				break;
			}

			case KTRL('U'): {
				memset(keymap_buffer, 0, sizeof keymap_buffer);
				n = 0;
				break;
			}

			default: {
				if (n == KEYMAP_ACTION_MAX) continue;

				if (n == 0) {
					memset(keymap_buffer, 0, sizeof keymap_buffer);
				}
				keymap_buffer[n++] = kp;
				break;
			}
		}
	}

	if (c.code && get_check("Keep this keymap? ")) {
		keymap_add(mode, c, keymap_buffer, true);
		prt("To use in other sessions, save the keymaps to a file.  Press a key to continue.", 17, 0);
		inkey();
	}
}